

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlXPathObjectPtr xmlXPathCacheNewNodeSet(xmlXPathParserContextPtr pctxt,xmlNodePtr val)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  xmlNodeSetPtr pxVar4;
  xmlXPathObjectPtr pxVar5;
  
  if ((pctxt->context == (xmlXPathContextPtr)0x0) ||
     (plVar1 = (long *)pctxt->context->cache, plVar1 == (long *)0x0)) goto LAB_001c1301;
  pxVar5 = (xmlXPathObjectPtr)*plVar1;
  if (pxVar5 == (xmlXPathObjectPtr)0x0) {
    if (plVar1[1] == 0) {
      bVar2 = true;
    }
    else {
      pxVar4 = xmlXPathNodeSetCreate(val);
      if (pxVar4 != (xmlNodeSetPtr)0x0) {
        pxVar5 = (xmlXPathObjectPtr)plVar1[1];
        plVar1[1] = (long)pxVar5->stringval;
        *(int *)(plVar1 + 3) = (int)plVar1[3] + -1;
        pxVar5->stringval = (xmlChar *)0x0;
        pxVar5->type = XPATH_NODESET;
        pxVar5->boolval = 0;
        pxVar5->nodesetval = pxVar4;
        goto LAB_001c12fb;
      }
      xmlXPathPErrMemory(pctxt);
      bVar2 = false;
      pxVar5 = (xmlXPathObjectPtr)0x0;
    }
  }
  else {
    *plVar1 = (long)pxVar5->stringval;
    *(int *)(plVar1 + 2) = (int)plVar1[2] + -1;
    pxVar5->stringval = (xmlChar *)0x0;
    pxVar5->type = XPATH_NODESET;
    pxVar5->boolval = 0;
    if (val != (xmlNodePtr)0x0) {
      pxVar4 = pxVar5->nodesetval;
      if ((pxVar4->nodeMax == 0) || (val->type == XML_NAMESPACE_DECL)) {
        iVar3 = xmlXPathNodeSetAddUnique(pxVar4,val);
        if (iVar3 < 0) {
          xmlXPathPErrMemory(pctxt);
        }
      }
      else {
        *pxVar4->nodeTab = val;
        pxVar5->nodesetval->nodeNr = 1;
      }
    }
LAB_001c12fb:
    bVar2 = false;
  }
  if (!bVar2) {
    return pxVar5;
  }
LAB_001c1301:
  pxVar5 = xmlXPathNewNodeSet(val);
  if (pxVar5 == (xmlXPathObjectPtr)0x0) {
    xmlXPathPErrMemory(pctxt);
  }
  return pxVar5;
}

Assistant:

static xmlXPathObjectPtr
xmlXPathCacheNewNodeSet(xmlXPathParserContextPtr pctxt, xmlNodePtr val)
{
    xmlXPathObjectPtr ret;
    xmlXPathContextPtr ctxt = pctxt->context;

    if ((ctxt != NULL) && (ctxt->cache != NULL)) {
	xmlXPathContextCachePtr cache = (xmlXPathContextCachePtr) ctxt->cache;

	if (cache->nodesetObjs != NULL) {
	    /*
	    * Use the nodeset-cache.
	    */
	    ret = cache->nodesetObjs;
            cache->nodesetObjs = (void *) ret->stringval;
            cache->numNodeset -= 1;
            ret->stringval = NULL;
	    ret->type = XPATH_NODESET;
	    ret->boolval = 0;
	    if (val) {
		if ((ret->nodesetval->nodeMax == 0) ||
		    (val->type == XML_NAMESPACE_DECL))
		{
		    if (xmlXPathNodeSetAddUnique(ret->nodesetval, val) < 0)
                        xmlXPathPErrMemory(pctxt);
		} else {
		    ret->nodesetval->nodeTab[0] = val;
		    ret->nodesetval->nodeNr = 1;
		}
	    }
	    return(ret);
	} else if (cache->miscObjs != NULL) {
            xmlNodeSetPtr set;
	    /*
	    * Fallback to misc-cache.
	    */

	    set = xmlXPathNodeSetCreate(val);
	    if (set == NULL) {
                xmlXPathPErrMemory(pctxt);
		return(NULL);
	    }

	    ret = cache->miscObjs;
            cache->miscObjs = (void *) ret->stringval;
            cache->numMisc -= 1;
            ret->stringval = NULL;
	    ret->type = XPATH_NODESET;
	    ret->boolval = 0;
	    ret->nodesetval = set;
	    return(ret);
	}
    }
    ret = xmlXPathNewNodeSet(val);
    if (ret == NULL)
        xmlXPathPErrMemory(pctxt);
    return(ret);
}